

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pcVar1;
  bool bVar2;
  pointer pbVar3;
  pointer pbVar4;
  undefined1 *puVar5;
  char cVar6;
  int iVar7;
  size_t sVar8;
  istream *piVar9;
  long lVar10;
  ulong uVar11;
  ostream *poVar12;
  long *plVar13;
  pointer pbVar14;
  int iVar15;
  str *psVar16;
  int iVar17;
  int iVar18;
  char *__s;
  ulong uVar19;
  bool bVar20;
  string ln;
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pr;
  ifstream fs;
  stringstream err;
  stringstream out;
  undefined1 auStack_658 [12];
  int local_64c;
  str *local_648;
  int local_63c;
  char *local_638;
  ulong local_630;
  char local_628 [16];
  value_type local_618;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5d8;
  str *local_5b8;
  undefined1 *local_5b0;
  size_t local_5a8;
  undefined1 local_5a0 [16];
  char *local_590;
  ios_base *local_588;
  ios_base *local_580;
  str *local_578;
  str *local_570;
  undefined1 *local_568 [2];
  undefined1 local_558 [16];
  long local_548 [3];
  int aiStack_52c [123];
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base aiStack_2c0 [264];
  ostream *local_1b8 [2];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  if (argc < 2) {
    __s = "tests.txt";
  }
  else {
    __s = argv[1];
  }
  std::ifstream::ifstream(local_548);
  local_5d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (str *)0x0;
  local_5d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (str *)0x0;
  local_5f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (str *)0x0;
  local_5f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (str *)0x0;
  local_638 = local_628;
  local_630 = 0;
  local_628[0] = '\0';
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  local_618._M_string_length = 0;
  local_618.field_2._M_local_buf[0] = '\0';
  std::ifstream::open((char *)local_548,(_Ios_Openmode)__s);
  if (*(int *)((long)aiStack_52c + *(long *)(local_548[0] + -0x18) + 4) == 0) {
    local_588 = aiStack_2c0;
    local_580 = aiStack_138;
    iVar15 = 0;
    iVar17 = 0;
    local_63c = 0;
    local_590 = __s;
LAB_001087b7:
    local_648 = (str *)CONCAT44(local_648._4_4_,iVar15);
    iVar18 = iVar17 + 2;
    do {
      iVar17 = iVar17 + 1;
      lVar10 = *(long *)(local_548[0] + -0x18);
      *(undefined4 *)((long)aiStack_52c + lVar10) = 1;
      std::ios::clear((int)auStack_658 + (int)lVar10 + 0x110);
      cVar6 = std::ios::widen((char)*(undefined8 *)(local_548[0] + -0x18) + (char)local_548);
      piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_548,(string *)&local_638,cVar6);
      if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"All tests succeeded\n",0x14);
        iVar18 = 0;
        goto LAB_00109039;
      }
      lVar10 = *(long *)(local_548[0] + -0x18);
      *(undefined4 *)((long)aiStack_52c + lVar10) = 5;
      std::ios::clear((int)auStack_658 + (int)lVar10 + 0x110);
      if (1 < local_630) {
        iVar7 = std::__cxx11::string::find(-8,(ulong)(uint)(int)*local_638);
        iVar15 = iVar7 + 1;
        if ((iVar15 != 0) && ((cVar6 = local_638[1], cVar6 == '=' || (cVar6 == '['))))
        goto LAB_001088aa;
      }
      iVar18 = iVar18 + 1;
    } while( true );
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Couldn\'t open the file: ",0x18);
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x115208);
  }
  else {
    sVar8 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar8);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  iVar18 = 1;
LAB_00109039:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p);
  }
  if (local_638 != local_628) {
    operator_delete(local_638);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5d8);
  std::ifstream::~ifstream(local_548);
  return iVar18;
LAB_001088aa:
  if ((2 < iVar15) &&
     ((local_5d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish ==
       local_5d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ||
      (local_5f8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish ==
       local_5f8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)))) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Bad test file format at line ",0x1d);
    plVar13 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar17);
    std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
LAB_00109112:
    std::ostream::put((char)plVar13);
    std::ostream::flush();
    iVar18 = 2;
    goto LAB_00109039;
  }
  if (cVar6 == '[') {
    lVar10 = std::__cxx11::string::find_first_not_of((char)&local_638,0x5b);
    if (lVar10 != -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Bad test file format at line ",0x1d);
      plVar13 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar17);
      std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
      goto LAB_00109112;
    }
    uVar19 = local_630 - 1;
    local_618._M_string_length = 0;
    *local_618._M_dataplus._M_p = '\0';
    bVar20 = true;
    iVar17 = iVar18;
    while( true ) {
      cVar6 = std::ios::widen((char)*(undefined8 *)(local_548[0] + -0x18) + (char)local_548);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_548,(string *)&local_638,cVar6);
      uVar11 = std::__cxx11::string::find_first_not_of((char)&local_638,0x5d);
      if (uVar19 <= local_630 && uVar19 <= uVar11) break;
      if (!bVar20) {
        std::__cxx11::string::append((char *)&local_618);
      }
      iVar17 = iVar17 + 1;
      bVar20 = false;
      std::__cxx11::string::_M_append((char *)&local_618,(ulong)local_638);
    }
    if (local_630 != uVar19) goto LAB_0010912f;
  }
  else {
    std::__cxx11::string::substr((ulong)local_1b8,(ulong)&local_638);
    std::__cxx11::string::operator=((string *)&local_618,(string *)local_1b8);
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0]);
    }
  }
  pbVar4 = local_5d8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = local_5f8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar14 = local_5f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (iVar7 == 0) {
    if ((1 < (int)local_648) &&
       (local_5d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_5d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)) {
      local_648 = local_5d8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      pbVar14 = local_5d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar1 = (pbVar14->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar1 != &pbVar14->field_2) {
          operator_delete(pcVar1);
        }
        pbVar14 = pbVar14 + 1;
      } while (pbVar14 != pbVar4);
      local_5d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = local_648;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_5d8,&local_618);
  }
  else if (iVar15 == 2) {
    if (((int)local_648 != 2) &&
       (psVar16 = local_5f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
       local_5f8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish !=
       local_5f8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)) {
      do {
        pcVar1 = (psVar16->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar1 != &psVar16->field_2) {
          operator_delete(pcVar1);
        }
        psVar16 = psVar16 + 1;
      } while (psVar16 != pbVar3);
      local_5f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar14;
    }
    iVar15 = 2;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_5f8,&local_618);
  }
  else {
    local_5b8 = local_5d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_578 = local_5d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_5d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_5d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_64c = 0;
    }
    else {
      local_64c = 0;
      do {
        local_648 = local_5f8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_570 = local_5f8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (local_5f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_5f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            std::__cxx11::stringstream::stringstream(local_340);
            interpreter(local_5b8,local_648,local_1a8,local_330);
            local_64c = local_64c + 1;
            if (iVar15 == 3) {
              std::__cxx11::stringbuf::str();
              sVar8 = local_5a8;
              if (local_5b0 != local_5a0) {
                operator_delete(local_5b0);
              }
              if (sVar8 == 0) {
                std::__cxx11::stringbuf::str();
                puVar5 = local_5b0;
                if (local_5a8 == local_618._M_string_length) {
                  if (local_5a8 == 0) {
                    bVar20 = false;
                  }
                  else {
                    iVar18 = bcmp(local_5b0,local_618._M_dataplus._M_p,local_5a8);
                    bVar20 = iVar18 != 0;
                  }
                }
                else {
                  bVar20 = true;
                }
                if (puVar5 != local_5a0) {
                  operator_delete(puVar5);
                }
                bVar2 = true;
                if (!bVar20) goto LAB_00108ecb;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Test failed: ",0xd);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"incorrect output",0x10);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr," on test #",10);
                poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_64c);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," at line ",9);
                plVar13 = (long *)std::ostream::operator<<((ostream *)poVar12,iVar17);
                std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Test failed: ",0xd);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"non-empty error output",0x16);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr," on test #",10);
                poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_64c);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," at line ",9);
                plVar13 = (long *)std::ostream::operator<<((ostream *)poVar12,iVar17);
                std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
              }
LAB_00108eae:
              std::ostream::put((char)plVar13);
              std::ostream::flush();
              local_63c = 3;
              bVar2 = false;
            }
            else {
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::substr((ulong)&local_5b0,(ulong)local_568);
              puVar5 = local_5b0;
              if (local_5a8 == local_618._M_string_length) {
                if (local_5a8 == 0) {
                  bVar20 = false;
                }
                else {
                  iVar18 = bcmp(local_5b0,local_618._M_dataplus._M_p,local_5a8);
                  bVar20 = iVar18 != 0;
                }
              }
              else {
                bVar20 = true;
              }
              if (puVar5 != local_5a0) {
                operator_delete(puVar5);
              }
              if (local_568[0] != local_558) {
                operator_delete(local_568[0]);
              }
              bVar2 = true;
              if (bVar20) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Test failed: ",0xd);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"incorrect error output",0x16);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr," on test #",10);
                poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_64c);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," at line ",9);
                plVar13 = (long *)std::ostream::operator<<((ostream *)poVar12,iVar17);
                std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
                goto LAB_00108eae;
              }
            }
LAB_00108ecb:
            std::__cxx11::stringstream::~stringstream(local_340);
            std::ios_base::~ios_base(local_588);
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
            std::ios_base::~ios_base(local_580);
            iVar18 = local_63c;
            if (!bVar2) goto LAB_00109039;
            local_648 = local_648 + 1;
          } while (local_648 != local_570);
        }
        local_5b8 = local_5b8 + 1;
      } while (local_5b8 != local_578);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Passed ",7);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_64c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," test(s) on line ",0x11);
    plVar13 = (long *)std::ostream::operator<<((ostream *)poVar12,iVar17);
    std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
    std::ostream::put((char)plVar13);
    std::ostream::flush();
  }
  goto LAB_001087b7;
LAB_0010912f:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Bad test file format at line ",0x1d);
  plVar13 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar17);
  std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
  std::ostream::put((char)plVar13);
  std::ostream::flush();
  iVar18 = 2;
  goto LAB_00109039;
}

Assistant:

int main(int argc, char* argv[])
{
    const char* fname = argc > 1 ? argv[1] : "tests.txt";

    std::ifstream fs;

    std::vector<std::string> pr, in;
    std::string ln, str;
    int line = 0;
#define READLN (++line, std::getline(fs, ln))
#define FMT_ASSERT(E) if(!(E)) { std::cerr << "Bad test file format at line " << line << std::endl; return 2; }
#define FAIL_TEST(MSG) std::cerr << "Test failed: " << MSG << " on test #" << ntests << " at line " << line <<std::endl; return 3

    try {
        fs.open(fname);
        if (!fs.good()) {
            std::cerr << "Couldn't open the file: " << fname << std::endl;
            return 1;
        }
        int last = 0;
        while (fs.exceptions(std::ifstream::badbit), READLN) {
            fs.exceptions(std::ifstream::failbit | std::ifstream::badbit);
            int t, blk;
            if (ln.size() >= 2 && (t = 1 + TYPES.find(ln[0])) && ((blk = ln[1] == BLOCK_O) || ln[1] == LINE_O)) {
                if (t > 2) FMT_ASSERT(pr.size() && in.size());
                if (blk) {
                    FMT_ASSERT(!~ln.find_first_not_of(BLOCK_O, 2));
                    size_t nb = ln.size() - 1;
                    bool first = true;
                    str.clear();
                    while (READLN, ln.find_first_not_of(BLOCK_C) < nb || ln.size() < nb) {
                        if (first) first = false;
                        else str.append("\n");
                        str.append(ln);
                    }
                    FMT_ASSERT(ln.size() == nb);
                } else str = ln.substr(2);
                if (t == 1) {
                    if (last > 1) pr.clear();
                    pr.push_back(str);
                } else if (t == 2) {
                    if (last != 2) in.clear();
                    in.push_back(str);
                } else {
                    int ntests = 0;
                    for (std::string &p : pr) {
                        for (std::string &i : in) {
                            ++ntests;
                            std::stringstream out, err;
                            interpreter(p, i, out, err);
                            if (t == 3) {
                                if (!err.str().empty()) {
                                    FAIL_TEST("non-empty error output");
                                }
                                if (out.str() != str) {
                                    FAIL_TEST("incorrect output");
                                }
                            } else {
                                if (err.str().substr(0, str.size()) != str) {
                                    FAIL_TEST("incorrect error output");
                                }
                            }
                        }
                    }
                    std::cout << "Passed " << ntests << " test(s) on line " << line << std::endl;
                }
                last = t;
            }
        }

    } catch (const decltype(fs)::failure& x) {
        std::cerr << "Error reading " << fname << " : " << x.what() << std::endl;
        return 1;
    }

    std::cout << "All tests succeeded\n";

    return 0;
}